

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_linetype.cpp
# Opt level: O1

void __thiscall ON_Linetype::ON_Linetype(ON_Linetype *this,ON_Linetype *src)

{
  ON_LinetypePrivate *src_00;
  ON_LinetypePrivate *this_00;
  
  ON_ModelComponent::ON_ModelComponent
            (&this->super_ON_ModelComponent,LinePattern,&src->super_ON_ModelComponent);
  (this->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object =
       (_func_int **)&PTR_ClassId_00821c08;
  this->m_private = (ON_LinetypePrivate *)0x0;
  this->m_is_set_bits = src->m_is_set_bits;
  this->m_is_locked_bits = src->m_is_locked_bits;
  this->m_cap_style = src->m_cap_style;
  this->m_join_style = src->m_join_style;
  this->m_width = src->m_width;
  this->m_width_units = src->m_width_units;
  this->m_reserved[0] = '\0';
  this->m_reserved[1] = '\0';
  this->m_reserved[2] = '\0';
  this->m_reserved[3] = '\0';
  this->m_reserved[3] = '\0';
  this->m_reserved[4] = '\0';
  this->m_reserved[5] = '\0';
  this->m_reserved[6] = '\0';
  this_00 = (ON_LinetypePrivate *)operator_new(0x38);
  src_00 = src->m_private;
  (this_00->m_segments)._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00821cf0;
  (this_00->m_segments).m_a = (ON_LinetypeSegment *)0x0;
  (this_00->m_segments).m_count = 0;
  (this_00->m_segments).m_capacity = 0;
  ON_SimpleArray<ON_LinetypeSegment>::operator=
            ((ON_SimpleArray<ON_LinetypeSegment> *)this_00,&src_00->m_segments);
  (this_00->m_taper_points)._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0081a0d8;
  (this_00->m_taper_points).m_a = (ON_2dPoint *)0x0;
  (this_00->m_taper_points).m_count = 0;
  (this_00->m_taper_points).m_capacity = 0;
  ON_SimpleArray<ON_2dPoint>::operator=(&this_00->m_taper_points,&src_00->m_taper_points);
  this_00->m_always_model_distances = src_00->m_always_model_distances;
  this->m_private = this_00;
  return;
}

Assistant:

ON_Linetype::ON_Linetype( const ON_Linetype& src )
  : ON_ModelComponent(ON_ModelComponent::Type::LinePattern,src)
  , m_is_set_bits(src.m_is_set_bits)
  , m_is_locked_bits(src.m_is_locked_bits)
  , m_cap_style(src.m_cap_style)
  , m_join_style(src.m_join_style)
  , m_width(src.m_width)
  , m_width_units(src.m_width_units)
{
  m_private = new ON_LinetypePrivate(*src.m_private);
}